

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

void __thiscall
wasm::TypeUpdater::makeBlockUnreachableIfNoFallThrough(TypeUpdater *this,Block *curr)

{
  ExpressionList *this_00;
  Expression **ppEVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1) {
    this_00 = &curr->list;
    if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements == 0) {
      pAVar2 = (ArenaVector<wasm::Expression_*> *)0x0;
    }
    else {
      ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      if (1 < ((*ppEVar1)->type).id) {
        return;
      }
      pAVar2 = (ArenaVector<wasm::Expression_*> *)
               (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    }
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    local_40 = (undefined1  [8])this_00;
    while( true ) {
      if ((__begin2.parent == pAVar2) && (local_40 == (undefined1  [8])this_00)) {
        return;
      }
      ppEVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_40);
      if (((*ppEVar1)->type).id == 1) break;
      __begin2.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin2.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    changeTypeTo(this,(Expression *)curr,(Type)0x1);
  }
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }